

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O2

void helics::BrokerFactory::displayHelp(CoreType type)

{
  shared_ptr<helics::Broker> brk;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  __shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  if ((type == UNRECOGNIZED) || (type == DEFAULT)) {
    std::operator<<((ostream *)&std::cout,"All core types have similar options\n");
    local_30 = 0;
    local_28[0] = 0;
    local_38 = local_28;
    makeBroker((CoreType)&brk,(string_view)ZEXT816(0));
    std::__cxx11::string::~string((string *)&local_38);
    (*(brk.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Broker[8])
              (brk.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr,6,"--help")
    ;
    local_30 = 0;
    local_28[0] = 0;
    local_38 = local_28;
    makeBroker((CoreType)&local_18,(string_view)ZEXT816(0xb));
    CLI::std::__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)&brk,&local_18);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18._M_refcount);
    std::__cxx11::string::~string((string *)&local_38);
    (*(brk.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Broker[8])
              (brk.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr,6,"--help")
    ;
  }
  else {
    local_38 = local_28;
    local_30 = 0;
    local_28[0] = 0;
    makeBroker((CoreType)&brk,(string_view)ZEXT416(type));
    std::__cxx11::string::~string((string *)&local_38);
    (*(brk.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Broker[8])
              (brk.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr,6,"--help")
    ;
  }
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &brk.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void displayHelp(CoreType type)
{
    if (type == CoreType::DEFAULT || type == CoreType::UNRECOGNIZED) {
        std::cout << "All core types have similar options\n";
        auto brk = makeBroker(CoreType::DEFAULT, std::string{});
        brk->configure(helpStr);
#ifdef HELICS_ENABLE_TCP_CORE
        brk = makeBroker(CoreType::TCP_SS, std::string{});
        brk->configure(helpStr);
#endif
    } else {
        auto brk = makeBroker(type, std::string{});
        brk->configure(helpStr);
    }
}